

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O0

TPZAutoPointer<TPZMatrix<std::complex<double>_>_> __thiscall
TPZSTShiftAndInvert<std::complex<double>_>::CalcMatrix
          (TPZSTShiftAndInvert<std::complex<double>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *A,
          TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *B)

{
  complex<double> value;
  int iVar1;
  TPZFMatrix<std::complex<double>_> *pTVar2;
  TPZMatrix<std::complex<double>_> *pTVar3;
  TPZFMatrix<std::complex<double>_> *this_00;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *in_RCX;
  TPZMatrix<std::complex<double>_> *in_RDX;
  TPZSTShiftOrigin<std::complex<double>_> *in_RSI;
  TPZFMatrix<std::complex<double>_> *in_RDI;
  size_t in_stack_00000058;
  char *in_stack_00000060;
  complex<double> *shift;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *shiftedMat;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *in_stack_fffffffffffffc38;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *in_stack_fffffffffffffc40;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffffc68;
  TPZFMatrix<std::complex<double>_> *this_01;
  TPZBaseMatrix local_180 [5];
  TPZBaseMatrix local_d8 [4];
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined1 local_21;
  
  local_21 = 0;
  this_01 = in_RDI;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  TPZSTShiftOrigin<std::complex<double>_>::Shift(in_RSI);
  local_30 = local_40;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_RDI);
  TPZMatrix<std::complex<double>_>::Storage(in_stack_fffffffffffffc68);
  pTVar2 = (TPZFMatrix<std::complex<double>_> *)TPZBaseMatrix::Rows(local_d8);
  pTVar3 = TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->(in_RCX);
  TPZMatrix<std::complex<double>_>::Storage(in_stack_fffffffffffffc68);
  this_00 = (TPZFMatrix<std::complex<double>_> *)TPZBaseMatrix::Rows(local_180);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            ((TPZFMatrixRef<std::complex<double>_> *)0x11bbecb);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            ((TPZFMatrixRef<std::complex<double>_> *)0x11bbed8);
  if (pTVar2 != this_00) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual TPZAutoPointer<TPZMatrix<TVar>> TPZSTShiftAndInvert<std::complex<double>>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>, TPZAutoPointer<TPZMatrix<TVar>>) const [TVar = std::complex<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,
                    "\nERROR: Matrices have uncompatible storage formats.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000060,in_stack_00000058);
  }
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->(in_RCX);
  TPZMatrix<std::complex<double>_>::Storage(&this_00->super_TPZMatrix<std::complex<double>_>);
  value._M_value._8_8_ = pTVar2;
  value._M_value._0_8_ = pTVar3;
  TPZFMatrix<std::complex<double>_>::operator*(this_00,value);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_RDI);
  TPZMatrix<std::complex<double>_>::Storage(&this_00->super_TPZMatrix<std::complex<double>_>);
  TPZFMatrix<std::complex<double>_>::operator-=(this_01,in_RDX);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            ((TPZFMatrixRef<std::complex<double>_> *)0x11bc02d);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x11bc03a);
  TPZFMatrixRef<std::complex<double>_>::~TPZFMatrixRef
            ((TPZFMatrixRef<std::complex<double>_> *)0x11bc047);
  pTVar3 = TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_RDI);
  iVar1 = (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  if (iVar1 == 0) {
    pTVar3 = TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_RDI);
    (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x17])();
  }
  else {
    pTVar3 = TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_RDI);
    (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1b])();
  }
  return (TPZAutoPointer<TPZMatrix<std::complex<double>_>_>)(TPZReference *)this_01;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftAndInvert<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  const auto &shift = this->Shift();
  if(shiftedMat->Storage().Rows() != B->Storage().Rows()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Matrices have uncompatible storage formats.\nAborting...\n";
    DebugStop();
  }
  shiftedMat->Storage() -= B->Storage() * shift;

  if (shiftedMat->IsSymmetric()) shiftedMat->Decompose_LDLt();
  else shiftedMat->Decompose_LU();
  return shiftedMat;
}